

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

yoml_t * resolve_tag(char *tag,yoml_t *node,void *cb_arg)

{
  char *__s1;
  long lVar1;
  int iVar2;
  ulong new_capacity;
  long lVar3;
  undefined8 *puVar4;
  h2o_iovec_t hVar5;
  yoml_parse_args_t local_48;
  
  iVar2 = strcmp(tag,"!file");
  if (iVar2 == 0) {
    if (node->type != YOML_TYPE_SCALAR) {
      resolve_tag_cold_1();
      return (yoml_t *)0x0;
    }
    __s1 = (node->data).scalar;
    lVar3 = *(long *)((long)cb_arg + 8);
    if (lVar3 != 0) {
      puVar4 = (undefined8 *)(*cb_arg + 0x10);
      do {
        iVar2 = strcmp(__s1,(char *)puVar4[-2]);
        if (iVar2 == 0) {
          node = (yoml_t *)*puVar4;
          goto LAB_0018b838;
        }
        puVar4 = puVar4 + 3;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    local_48.mem_set = (_func_void_ptr_void_ptr_int_size_t *)0x0;
    local_48.resolve_tag.cb = resolve_tag;
    local_48.filename = __s1;
    local_48.resolve_tag.cb_arg = cb_arg;
    node = load_config(&local_48,node);
    if (node == (yoml_t *)0x0) {
      return (yoml_t *)0x0;
    }
    new_capacity = *(long *)((long)cb_arg + 8) + 1;
    if (*(ulong *)((long)cb_arg + 0x10) < new_capacity) {
      h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)cb_arg,0x18,new_capacity);
    }
    hVar5 = h2o_strdup((h2o_mem_pool_t *)0x0,__s1,0xffffffffffffffff);
    lVar3 = *cb_arg;
    lVar1 = *(long *)((long)cb_arg + 8);
    *(long *)((long)cb_arg + 8) = lVar1 + 1;
    *(char **)(lVar3 + lVar1 * 0x18) = hVar5.base;
    *(size_t *)(lVar3 + 8 + lVar1 * 0x18) = hVar5.len;
    *(yoml_t **)(lVar3 + 0x10 + lVar1 * 0x18) = node;
  }
LAB_0018b838:
  node->_refcnt = node->_refcnt + 1;
  return node;
}

Assistant:

static yoml_t *resolve_tag(const char *tag, yoml_t *node, void *cb_arg)
{
    resolve_tag_arg_t *arg = (resolve_tag_arg_t *)cb_arg;

    if (strcmp(tag, "!file") == 0) {
        return resolve_file_tag(node, arg);
    }

    /* otherwise, return the node itself */
    ++node->_refcnt;
    return node;
}